

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_nodes.h
# Opt level: O0

void __thiscall spvtools::opt::SEAddNode::~SEAddNode(SEAddNode *this)

{
  SEAddNode *this_local;
  
  ~SEAddNode(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

explicit SEAddNode(ScalarEvolutionAnalysis* parent_analysis)
      : SENode(parent_analysis) {}